

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O3

void ncnn::transpose_pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [32];
  undefined4 *puVar21;
  size_t *psVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  
  iVar1 = A->elempack;
  psVar22 = (size_t *)&A->w;
  if (A->dims == 3) {
    psVar22 = &A->cstep;
  }
  iVar2 = (int)*psVar22;
  uVar18 = 0;
  lVar23 = (long)iVar2;
  lVar26 = (long)i;
  if (7 < max_ii) {
    lVar27 = (long)(iVar2 * k);
    lVar29 = lVar26 * 0x20 + lVar27 * 4 + 0xe0;
    lVar25 = lVar26 * 0x10 + lVar27 * 4 + 0x70;
    lVar27 = lVar27 * 4 + lVar26 * 4;
    uVar19 = 0;
    do {
      if (iVar1 == 8) {
        if (7 < max_kk) {
          pauVar20 = (undefined1 (*) [32])((long)A->data + lVar29);
          iVar16 = 7;
          do {
            auVar13 = vunpcklps_avx(pauVar20[-7],pauVar20[-6]);
            auVar6 = vunpckhps_avx(pauVar20[-7],pauVar20[-6]);
            auVar14 = vunpcklps_avx(pauVar20[-5],pauVar20[-4]);
            auVar7 = vunpckhps_avx(pauVar20[-5],pauVar20[-4]);
            auVar15 = vunpcklps_avx(pauVar20[-3],pauVar20[-2]);
            auVar8 = vunpckhps_avx(pauVar20[-3],pauVar20[-2]);
            auVar36 = vunpcklps_avx(pauVar20[-1],*pauVar20);
            auVar9 = vunpckhps_avx(pauVar20[-1],*pauVar20);
            auVar10 = vunpcklpd_avx(auVar13,auVar14);
            auVar13 = vunpckhpd_avx(auVar13,auVar14);
            auVar14 = vunpcklpd_avx(auVar6,auVar7);
            auVar6 = vunpckhpd_avx(auVar6,auVar7);
            auVar11 = vunpcklpd_avx(auVar15,auVar36);
            auVar7 = vunpckhpd_avx(auVar15,auVar36);
            auVar15 = vunpcklpd_avx(auVar8,auVar9);
            auVar8 = vunpckhpd_avx(auVar8,auVar9);
            auVar33 = auVar11._0_16_;
            auVar32 = auVar13._0_16_;
            auVar34 = auVar7._0_16_;
            auVar36._16_16_ = auVar15._0_16_;
            auVar36._0_16_ = auVar14._0_16_;
            auVar31 = auVar6._0_16_;
            auVar35 = auVar8._0_16_;
            auVar9 = vperm2f128_avx(auVar10,auVar11,0x31);
            auVar13 = vperm2f128_avx(auVar13,auVar7,0x31);
            auVar7 = vperm2f128_avx(auVar14,auVar15,0x31);
            auVar6 = vperm2f128_avx(auVar6,auVar8,0x31);
            AT->data = (void *)SUB168(auVar10._0_16_,0);
            AT->refcount = (int *)SUB168(auVar10._0_16_,8);
            AT->elemsize = auVar33._0_8_;
            AT->elempack = auVar33._8_4_;
            *(int *)&AT->field_0x1c = auVar33._12_4_;
            AT->allocator = (Allocator *)auVar32._0_8_;
            AT->dims = auVar32._8_4_;
            AT->w = auVar32._12_4_;
            AT->h = auVar34._0_4_;
            AT->d = auVar34._4_4_;
            AT->c = auVar34._8_4_;
            *(int *)&AT->field_0x3c = auVar34._12_4_;
            *(undefined1 (*) [32])&AT->cstep = auVar36;
            AT[1].elempack = auVar31._0_4_;
            *(int *)&AT[1].field_0x1c = auVar31._4_4_;
            AT[1].allocator = (Allocator *)auVar31._8_8_;
            AT[1].dims = auVar35._0_4_;
            AT[1].w = auVar35._4_4_;
            AT[1].h = auVar35._8_4_;
            AT[1].d = auVar35._12_4_;
            *(undefined1 (*) [32])&AT[1].c = auVar9;
            AT[2].elemsize = auVar13._0_8_;
            AT[2].elempack = auVar13._8_4_;
            *(int *)&AT[2].field_0x1c = auVar13._12_4_;
            AT[2].allocator = (Allocator *)auVar13._16_8_;
            AT[2].dims = auVar13._24_4_;
            AT[2].w = auVar13._28_4_;
            *(undefined1 (*) [32])&AT[2].h = auVar7;
            AT[3].refcount = (int *)auVar6._0_8_;
            AT[3].elemsize = auVar6._8_8_;
            AT[3].elempack = auVar6._16_4_;
            *(int *)&AT[3].field_0x1c = auVar6._20_4_;
            AT[3].allocator = (Allocator *)auVar6._24_8_;
            AT = (Mat *)&AT[3].dims;
            pauVar20 = (undefined1 (*) [32])(*pauVar20 + (long)(iVar2 * 8) * 4);
            iVar16 = iVar16 + 8;
          } while (iVar16 < max_kk);
          goto LAB_004d00dd;
        }
      }
      else {
LAB_004d00dd:
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_004d01d0;
          pauVar17 = (undefined1 (*) [16])((long)A->data + lVar25);
          iVar16 = 3;
          do {
            auVar32 = vunpcklps_avx(pauVar17[-7],pauVar17[-6]);
            auVar35 = vunpcklps_avx(pauVar17[-5],pauVar17[-4]);
            auVar33 = vunpckhps_avx(pauVar17[-7],pauVar17[-6]);
            auVar34 = vunpckhps_avx(pauVar17[-5],pauVar17[-4]);
            auVar31 = vmovlhps_avx(auVar32,auVar35);
            auVar35 = vunpckhpd_avx(auVar32,auVar35);
            auVar32 = vmovlhps_avx(auVar33,auVar34);
            auVar3 = vunpckhpd_avx(auVar33,auVar34);
            auVar34 = vunpcklps_avx(pauVar17[-3],pauVar17[-2]);
            auVar12 = vunpcklps_avx(pauVar17[-1],*pauVar17);
            auVar4 = vunpckhps_avx(pauVar17[-3],pauVar17[-2]);
            auVar5 = vunpckhps_avx(pauVar17[-1],*pauVar17);
            auVar33 = vmovlhps_avx(auVar34,auVar12);
            auVar12 = vunpckhpd_avx(auVar34,auVar12);
            auVar34 = vmovlhps_avx(auVar4,auVar5);
            auVar4 = vunpckhpd_avx(auVar4,auVar5);
            AT->data = (void *)auVar31._0_8_;
            AT->refcount = (int *)auVar31._8_8_;
            AT->elemsize = auVar33._0_8_;
            AT->elempack = auVar33._8_4_;
            *(int *)&AT->field_0x1c = auVar33._12_4_;
            AT->allocator = (Allocator *)auVar35._0_8_;
            AT->dims = auVar35._8_4_;
            AT->w = auVar35._12_4_;
            AT->h = auVar12._0_4_;
            AT->d = auVar12._4_4_;
            AT->c = auVar12._8_4_;
            *(int *)&AT->field_0x3c = auVar12._12_4_;
            *(undefined1 (*) [16])&AT->cstep = auVar32;
            AT[1].refcount = (int *)auVar34._0_8_;
            AT[1].elemsize = auVar34._8_8_;
            AT[1].elempack = auVar3._0_4_;
            *(int *)&AT[1].field_0x1c = auVar3._4_4_;
            AT[1].allocator = (Allocator *)auVar3._8_8_;
            AT[1].dims = auVar4._0_4_;
            AT[1].w = auVar4._4_4_;
            AT[1].h = auVar4._8_4_;
            AT[1].d = auVar4._12_4_;
            AT = (Mat *)&AT[1].c;
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + (long)(iVar2 * 4) * 4);
            iVar16 = iVar16 + 4;
          } while (iVar16 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          pauVar20 = (undefined1 (*) [32])((long)A->data + lVar27);
          iVar16 = max_kk;
          do {
            *(undefined1 (*) [32])AT = *pauVar20;
            AT = (Mat *)&AT->allocator;
            pauVar20 = (undefined1 (*) [32])(*pauVar20 + lVar23 * 4);
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
        }
      }
LAB_004d01d0:
      uVar18 = uVar19 + 8;
      uVar28 = uVar19 + 0xf;
      lVar29 = lVar29 + 0x100;
      lVar25 = lVar25 + 0x80;
      lVar27 = lVar27 + 0x20;
      uVar19 = uVar18;
    } while (uVar28 < (uint)max_ii);
  }
  lVar27 = (long)max_ii;
  if ((int)((uint)uVar18 | 3) < max_ii) {
    lVar25 = (long)(iVar2 * k);
    uVar19 = uVar18 & 0xffffffff;
    lVar29 = (lVar26 + uVar19) * 0x20 + lVar25 * 4 + 0x60;
    lVar30 = (lVar26 + uVar19) * 0x10 + lVar25 * 4 + 0x30;
    lVar25 = lVar25 * 4 + lVar26 * 4 + uVar19 * 4;
    do {
      if (iVar1 == 8) {
        if (7 < max_kk) {
          pauVar20 = (undefined1 (*) [32])((long)A->data + lVar29);
          iVar16 = 7;
          do {
            auVar13 = vunpcklps_avx(pauVar20[-3],pauVar20[-2]);
            auVar6 = vunpckhps_avx(pauVar20[-3],pauVar20[-2]);
            auVar9 = vunpcklps_avx(pauVar20[-1],*pauVar20);
            auVar7 = vunpckhps_avx(pauVar20[-1],*pauVar20);
            auVar8 = vunpcklpd_avx(auVar13,auVar9);
            auVar13 = vunpckhpd_avx(auVar13,auVar9);
            auVar9 = vunpcklpd_avx(auVar6,auVar7);
            auVar6 = vunpckhpd_avx(auVar6,auVar7);
            auVar32 = auVar13._0_16_;
            auVar33 = auVar9._0_16_;
            auVar31 = auVar6._0_16_;
            auVar13 = vperm2f128_avx(auVar8,auVar13,0x31);
            auVar6 = vperm2f128_avx(auVar9,auVar6,0x31);
            AT->data = (void *)SUB168(auVar8._0_16_,0);
            AT->refcount = (int *)SUB168(auVar8._0_16_,8);
            AT->elemsize = auVar32._0_8_;
            AT->elempack = auVar32._8_4_;
            *(int *)&AT->field_0x1c = auVar32._12_4_;
            AT->allocator = (Allocator *)auVar33._0_8_;
            AT->dims = auVar33._8_4_;
            AT->w = auVar33._12_4_;
            AT->h = auVar31._0_4_;
            AT->d = auVar31._4_4_;
            AT->c = auVar31._8_4_;
            *(int *)&AT->field_0x3c = auVar31._12_4_;
            *(undefined1 (*) [32])&AT->cstep = auVar13;
            AT[1].elempack = auVar6._0_4_;
            *(int *)&AT[1].field_0x1c = auVar6._4_4_;
            AT[1].allocator = (Allocator *)auVar6._8_8_;
            AT[1].dims = auVar6._16_4_;
            AT[1].w = auVar6._20_4_;
            AT[1].h = auVar6._24_4_;
            AT[1].d = auVar6._28_4_;
            AT = (Mat *)&AT[1].c;
            pauVar20 = (undefined1 (*) [32])(*pauVar20 + (long)(iVar2 * 8) * 4);
            iVar16 = iVar16 + 8;
          } while (iVar16 < max_kk);
          goto LAB_004d031e;
        }
      }
      else {
LAB_004d031e:
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_004d03bd;
          pauVar17 = (undefined1 (*) [16])((long)A->data + lVar30);
          iVar16 = 3;
          do {
            auVar32 = vunpcklps_avx(pauVar17[-3],pauVar17[-2]);
            auVar33 = vunpcklps_avx(pauVar17[-1],*pauVar17);
            auVar34 = vunpckhps_avx(pauVar17[-3],pauVar17[-2]);
            auVar35 = vunpckhps_avx(pauVar17[-1],*pauVar17);
            auVar31 = vmovlhps_avx(auVar32,auVar33);
            auVar33 = vunpckhpd_avx(auVar32,auVar33);
            auVar32 = vmovlhps_avx(auVar34,auVar35);
            auVar34 = vunpckhpd_avx(auVar34,auVar35);
            AT->data = (void *)auVar31._0_8_;
            AT->refcount = (int *)auVar31._8_8_;
            AT->elemsize = auVar33._0_8_;
            AT->elempack = auVar33._8_4_;
            *(int *)&AT->field_0x1c = auVar33._12_4_;
            AT->allocator = (Allocator *)auVar32._0_8_;
            AT->dims = auVar32._8_4_;
            AT->w = auVar32._12_4_;
            AT->h = auVar34._0_4_;
            AT->d = auVar34._4_4_;
            AT->c = auVar34._8_4_;
            *(int *)&AT->field_0x3c = auVar34._12_4_;
            AT = (Mat *)&AT->cstep;
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + (long)(iVar2 * 4) * 4);
            iVar16 = iVar16 + 4;
          } while (iVar16 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          pauVar17 = (undefined1 (*) [16])((long)A->data + lVar25);
          iVar16 = max_kk;
          do {
            *(undefined1 (*) [16])AT = *pauVar17;
            AT = (Mat *)&AT->elemsize;
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + lVar23 * 4);
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
        }
      }
LAB_004d03bd:
      uVar18 = uVar19 + 4;
      lVar24 = uVar19 + 7;
      lVar29 = lVar29 + 0x80;
      lVar30 = lVar30 + 0x40;
      lVar25 = lVar25 + 0x10;
      uVar19 = uVar18;
    } while (lVar24 < lVar27);
  }
  if ((int)((uint)uVar18 | 1) < max_ii) {
    lVar25 = (long)(iVar2 * k);
    uVar19 = uVar18 & 0xffffffff;
    lVar29 = (lVar26 + uVar19) * 0x20 + lVar25 * 4 + 0x20;
    lVar30 = (lVar26 + uVar19) * 0x10 + lVar25 * 4 + 0x10;
    lVar25 = lVar25 * 4 + lVar26 * 4 + uVar19 * 4 + 4;
    do {
      if (iVar1 == 8) {
        if (7 < max_kk) {
          pauVar20 = (undefined1 (*) [32])((long)A->data + lVar29);
          iVar16 = 7;
          do {
            auVar6 = vunpcklps_avx(pauVar20[-1],*pauVar20);
            auVar13 = vunpckhps_avx(pauVar20[-1],*pauVar20);
            auVar31 = auVar13._0_16_;
            auVar13 = vperm2f128_avx(auVar6,auVar13,0x31);
            AT->data = (void *)SUB168(auVar6._0_16_,0);
            AT->refcount = (int *)SUB168(auVar6._0_16_,8);
            AT->elemsize = auVar31._0_8_;
            AT->elempack = auVar31._8_4_;
            *(int *)&AT->field_0x1c = auVar31._12_4_;
            AT->allocator = (Allocator *)auVar13._0_8_;
            AT->dims = auVar13._8_4_;
            AT->w = auVar13._12_4_;
            AT->h = auVar13._16_4_;
            AT->d = auVar13._20_4_;
            AT->c = auVar13._24_4_;
            *(int *)&AT->field_0x3c = auVar13._28_4_;
            AT = (Mat *)&AT->cstep;
            iVar16 = iVar16 + 8;
            pauVar20 = (undefined1 (*) [32])(*pauVar20 + (long)(iVar2 * 8) * 4);
          } while (iVar16 < max_kk);
          goto LAB_004d04cb;
        }
      }
      else {
LAB_004d04cb:
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_004d0545;
          pauVar17 = (undefined1 (*) [16])((long)A->data + lVar30);
          iVar16 = 3;
          do {
            auVar32 = vunpcklps_avx(pauVar17[-1],*pauVar17);
            auVar31 = vunpckhps_avx(pauVar17[-1],*pauVar17);
            AT->data = (void *)auVar32._0_8_;
            AT->refcount = (int *)auVar32._8_8_;
            AT->elemsize = auVar31._0_8_;
            AT->elempack = auVar31._8_4_;
            *(int *)&AT->field_0x1c = auVar31._12_4_;
            AT = (Mat *)&AT->allocator;
            iVar16 = iVar16 + 4;
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + (long)(iVar2 * 4) * 4);
          } while (iVar16 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          puVar21 = (undefined4 *)((long)A->data + lVar25);
          iVar16 = max_kk;
          do {
            *(undefined4 *)&AT->data = puVar21[-1];
            *(undefined4 *)((long)&AT->data + 4) = *puVar21;
            AT = (Mat *)&AT->refcount;
            puVar21 = puVar21 + lVar23;
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
        }
      }
LAB_004d0545:
      uVar18 = uVar19 + 2;
      lVar24 = uVar19 + 3;
      lVar29 = lVar29 + 0x40;
      lVar30 = lVar30 + 0x20;
      lVar25 = lVar25 + 8;
      uVar19 = uVar18;
    } while (lVar24 < lVar27);
  }
  if ((int)uVar18 < max_ii) {
    lVar24 = (long)(k * iVar2);
    lVar30 = (long)(int)uVar18;
    lVar25 = (lVar30 + lVar26) * 0x20 + lVar24 * 4;
    lVar29 = (lVar30 + lVar26) * 0x10 + lVar24 * 4;
    lVar26 = lVar24 * 4 + lVar26 * 4 + lVar30 * 4;
    do {
      if (iVar1 == 8) {
        if (7 < max_kk) {
          pauVar20 = (undefined1 (*) [32])((long)A->data + lVar25);
          iVar16 = 7;
          do {
            *(undefined1 (*) [32])AT = *pauVar20;
            AT = (Mat *)&AT->allocator;
            iVar16 = iVar16 + 8;
            pauVar20 = (undefined1 (*) [32])(*pauVar20 + (long)(iVar2 * 8) * 4);
          } while (iVar16 < max_kk);
          goto LAB_004d0617;
        }
      }
      else {
LAB_004d0617:
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_004d0672;
          pauVar17 = (undefined1 (*) [16])((long)A->data + lVar29);
          iVar16 = 3;
          do {
            *(undefined1 (*) [16])AT = *pauVar17;
            AT = (Mat *)&AT->elemsize;
            iVar16 = iVar16 + 4;
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + (long)(iVar2 * 4) * 4);
          } while (iVar16 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          puVar21 = (undefined4 *)((long)A->data + lVar26);
          iVar16 = max_kk;
          do {
            *(undefined4 *)&AT->data = *puVar21;
            AT = (Mat *)((long)&AT->data + 4);
            puVar21 = puVar21 + lVar23;
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
        }
      }
LAB_004d0672:
      lVar30 = lVar30 + 1;
      lVar25 = lVar25 + 0x20;
      lVar29 = lVar29 + 0x10;
      lVar26 = lVar26 + 4;
    } while (lVar30 != lVar27);
  }
  return;
}

Assistant:

static void transpose_pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                __m512 _rc = _mm512_load_ps(p0 + 16 * 12);
                __m512 _rd = _mm512_load_ps(p0 + 16 * 13);
                __m512 _re = _mm512_load_ps(p0 + 16 * 14);
                __m512 _rf = _mm512_load_ps(p0 + 16 * 15);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += A_hstep * 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                __m256 _rc = _mm256_load_ps(p0 + 8 * 12);
                __m256 _rd = _mm256_load_ps(p0 + 8 * 13);
                __m256 _re = _mm256_load_ps(p0 + 8 * 14);
                __m256 _rf = _mm256_load_ps(p0 + 8 * 15);

                transpose8x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                __m512 _rr0 = _mm512_insertf32x8(_mm512_castps256_ps512(_r0), _r1, 1);
                __m512 _rr1 = _mm512_insertf32x8(_mm512_castps256_ps512(_r2), _r3, 1);
                __m512 _rr2 = _mm512_insertf32x8(_mm512_castps256_ps512(_r4), _r5, 1);
                __m512 _rr3 = _mm512_insertf32x8(_mm512_castps256_ps512(_r6), _r7, 1);
                __m512 _rr4 = _mm512_insertf32x8(_mm512_castps256_ps512(_r8), _r9, 1);
                __m512 _rr5 = _mm512_insertf32x8(_mm512_castps256_ps512(_ra), _rb, 1);
                __m512 _rr6 = _mm512_insertf32x8(_mm512_castps256_ps512(_rc), _rd, 1);
                __m512 _rr7 = _mm512_insertf32x8(_mm512_castps256_ps512(_re), _rf, 1);

                _mm512_store_ps(pp, _rr0);
                _mm512_store_ps(pp + 16 * 1, _rr1);
                _mm512_store_ps(pp + 16 * 2, _rr2);
                _mm512_store_ps(pp + 16 * 3, _rr3);
                _mm512_store_ps(pp + 16 * 4, _rr4);
                _mm512_store_ps(pp + 16 * 5, _rr5);
                _mm512_store_ps(pp + 16 * 6, _rr6);
                _mm512_store_ps(pp + 16 * 7, _rr7);
                pp += 128;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                __m128 _rc = _mm_load_ps(p0 + 4 * 12);
                __m128 _rd = _mm_load_ps(p0 + 4 * 13);
                __m128 _re = _mm_load_ps(p0 + 4 * 14);
                __m128 _rf = _mm_load_ps(p0 + 4 * 15);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _rc);
                _mm_store_ps(pp + 4 * 4, _r1);
                _mm_store_ps(pp + 4 * 5, _r5);
                _mm_store_ps(pp + 4 * 6, _r9);
                _mm_store_ps(pp + 4 * 7, _rd);
                _mm_store_ps(pp + 4 * 8, _r2);
                _mm_store_ps(pp + 4 * 9, _r6);
                _mm_store_ps(pp + 4 * 10, _ra);
                _mm_store_ps(pp + 4 * 11, _re);
                _mm_store_ps(pp + 4 * 12, _r3);
                _mm_store_ps(pp + 4 * 13, _r7);
                _mm_store_ps(pp + 4 * 14, _rb);
                _mm_store_ps(pp + 4 * 15, _rf);
                pp += 64;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_loadu_ps(p0));
                pp += 16;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += A_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += A_hstep;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += A_hstep;
            }
        }
    }
}